

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

faup_url_field_t faup_options_get_field_from_name(char *name)

{
  int iVar1;
  faup_url_field_t fVar2;
  
  iVar1 = strcmp("scheme",name);
  if (iVar1 == 0) {
    fVar2 = FAUP_URL_FIELD_SCHEME;
  }
  else {
    iVar1 = strcmp("credential",name);
    if (iVar1 == 0) {
      fVar2 = FAUP_URL_FIELD_CREDENTIAL;
    }
    else {
      iVar1 = strcmp("subdomain",name);
      if (iVar1 == 0) {
        fVar2 = FAUP_URL_FIELD_SUBDOMAIN;
      }
      else {
        iVar1 = strcmp("domain",name);
        if (iVar1 == 0) {
          fVar2 = FAUP_URL_FIELD_DOMAIN;
        }
        else {
          iVar1 = strcmp("domain_without_tld",name);
          if (iVar1 == 0) {
            fVar2 = FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD;
          }
          else {
            iVar1 = strcmp("host",name);
            if (iVar1 == 0) {
              fVar2 = FAUP_URL_FIELD_HOST;
            }
            else {
              iVar1 = strcmp("tld",name);
              if (iVar1 == 0) {
                fVar2 = FAUP_URL_FIELD_TLD;
              }
              else {
                iVar1 = strcmp("port",name);
                if (iVar1 == 0) {
                  fVar2 = FAUP_URL_FIELD_PORT;
                }
                else {
                  iVar1 = strcmp("resource_path",name);
                  if (iVar1 == 0) {
                    fVar2 = FAUP_URL_FIELD_RESOURCE_PATH;
                  }
                  else {
                    iVar1 = strcmp("query_string",name);
                    if (iVar1 == 0) {
                      fVar2 = FAUP_URL_FIELD_QUERY_STRING;
                    }
                    else {
                      iVar1 = strcmp("fragment",name);
                      if (iVar1 == 0) {
                        fVar2 = FAUP_URL_FIELD_FRAGMENT;
                      }
                      else {
                        iVar1 = strcmp("url_type",name);
                        fVar2 = FAUP_URL_FIELD_NONE;
                        if (iVar1 == 0) {
                          fVar2 = FAUP_URL_FIELD_URL_TYPE;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return fVar2;
}

Assistant:

faup_url_field_t faup_options_get_field_from_name(char *name)
{
  	if (!strcmp("scheme", name)) {
  		return FAUP_URL_FIELD_SCHEME;
  	}
  	if (!strcmp("credential", name)) {
  		return FAUP_URL_FIELD_CREDENTIAL;
  	}
  	if (!strcmp("subdomain", name)) {
  		return FAUP_URL_FIELD_SUBDOMAIN;
  	}
  	if (!strcmp("domain", name)) {
  		return FAUP_URL_FIELD_DOMAIN;
  	}
  	if (!strcmp("domain_without_tld", name)) {
  		return FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD;
  	}
  	if (!strcmp("host", name)) {
  		return FAUP_URL_FIELD_HOST;
  	}
  	if (!strcmp("tld", name)) {
  		return FAUP_URL_FIELD_TLD;
  	}
  	if (!strcmp("port", name)) {
  		return FAUP_URL_FIELD_PORT;
  	}
  	if (!strcmp("resource_path", name)) {
  		return FAUP_URL_FIELD_RESOURCE_PATH;
  	}
  	if (!strcmp("query_string", name)) {
  		return FAUP_URL_FIELD_QUERY_STRING;
  	}
  	if (!strcmp("fragment", name)) {
  		return FAUP_URL_FIELD_FRAGMENT;
  	}
  	if (!strcmp("url_type", name)) {
  		return FAUP_URL_FIELD_URL_TYPE;
  	}

  	return FAUP_URL_FIELD_NONE;
}